

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

S2Point * __thiscall
S2Polyline::GetSuffix
          (S2Point *__return_storage_ptr__,S2Polyline *this,double fraction,int *next_vertex)

{
  double *pdVar1;
  VType VVar2;
  undefined8 uVar3;
  uint uVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  long lVar7;
  double *ap;
  int iVar8;
  bool bVar9;
  S1Angle SVar10;
  double dVar11;
  S1Angle ax_angle;
  S1Angle length;
  S1Angle local_48;
  S2LogMessage local_40;
  
  if (this->num_vertices_ < 1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0xa9,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: (num_vertices()) > (0) ",0x25);
    abort();
  }
  dVar11 = 0.0;
  if (fraction <= 0.0) {
    *next_vertex = 1;
    iVar8 = 0;
  }
  else {
    if (1 < this->num_vertices_) {
      iVar8 = 1;
      do {
        pSVar5 = vertex(this,iVar8 + -1);
        pSVar6 = vertex(this,iVar8);
        S1Angle::S1Angle(&local_48,pSVar5,pSVar6);
        dVar11 = dVar11 + local_48.radians_;
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->num_vertices_);
    }
    if (1 < this->num_vertices_) {
      iVar8 = 1;
      ax_angle.radians_ = dVar11 * fraction;
      do {
        pSVar5 = vertex(this,iVar8 + -1);
        pSVar6 = vertex(this,iVar8);
        S1Angle::S1Angle((S1Angle *)&local_40,pSVar5,pSVar6);
        uVar3 = local_40._0_8_;
        if ((double)local_40._0_8_ <= ax_angle.radians_) {
          SVar10.radians_ = ax_angle.radians_ - (double)local_40._0_8_;
        }
        else {
          pSVar5 = vertex(this,iVar8 + -1);
          pSVar6 = vertex(this,iVar8);
          S2::InterpolateAtDistance(__return_storage_ptr__,ax_angle,pSVar5,pSVar6);
          pSVar5 = vertex(this,iVar8);
          if ((__return_storage_ptr__->c_[0] != pSVar5->c_[0]) ||
             (NAN(__return_storage_ptr__->c_[0]) || NAN(pSVar5->c_[0]))) {
            uVar4 = 0;
          }
          else {
            lVar7 = 0;
            do {
              bVar9 = lVar7 == 0x10;
              if (bVar9) goto LAB_00212c11;
              dVar11 = *(double *)((long)__return_storage_ptr__->c_ + lVar7 + 8);
              pdVar1 = (double *)((long)pSVar5->c_ + lVar7 + 8);
              lVar7 = lVar7 + 8;
            } while ((dVar11 == *pdVar1) && (!NAN(dVar11) && !NAN(*pdVar1)));
            bVar9 = false;
LAB_00212c11:
            uVar4 = (uint)bVar9;
          }
          *next_vertex = uVar4 + iVar8;
          SVar10.radians_ = ax_angle.radians_;
        }
        if (ax_angle.radians_ < (double)uVar3) {
          return __return_storage_ptr__;
        }
        iVar8 = iVar8 + 1;
        ax_angle.radians_ = SVar10.radians_;
      } while (iVar8 < this->num_vertices_);
    }
    *next_vertex = this->num_vertices_;
    iVar8 = this->num_vertices_ + -1;
  }
  pSVar5 = vertex(this,iVar8);
  VVar2 = pSVar5->c_[1];
  __return_storage_ptr__->c_[0] = pSVar5->c_[0];
  __return_storage_ptr__->c_[1] = VVar2;
  __return_storage_ptr__->c_[2] = pSVar5->c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polyline::GetSuffix(double fraction, int* next_vertex) const {
  S2_DCHECK_GT(num_vertices(), 0);
  // We intentionally let the (fraction >= 1) case fall through, since
  // we need to handle it in the loop below in any case because of
  // possible roundoff errors.
  if (fraction <= 0) {
    *next_vertex = 1;
    return vertex(0);
  }
  S1Angle length_sum;
  for (int i = 1; i < num_vertices(); ++i) {
    length_sum += S1Angle(vertex(i-1), vertex(i));
  }
  S1Angle target = fraction * length_sum;
  for (int i = 1; i < num_vertices(); ++i) {
    S1Angle length(vertex(i-1), vertex(i));
    if (target < length) {
      // This interpolates with respect to arc length rather than
      // straight-line distance, and produces a unit-length result.
      S2Point result = S2::InterpolateAtDistance(target, vertex(i-1),
                                                         vertex(i));
      // It is possible that (result == vertex(i)) due to rounding errors.
      *next_vertex = (result == vertex(i)) ? (i + 1) : i;
      return result;
    }
    target -= length;
  }
  *next_vertex = num_vertices();
  return vertex(num_vertices() - 1);
}